

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O2

int cvLsPSetup(void *cvode_mem)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_10;
  CVodeMem local_8;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"cvLsPSetup",&local_8,&local_10);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = (*local_10->pset)(local_8->cv_tn,local_10->ycur,local_10->fcur,
                            SUB14(local_10->jbad == 0,0),&local_8->cv_jcur,local_8->cv_gamma,
                            local_10->P_data);
  return iVar1;
}

Assistant:

int cvLsPSetup(void* cvode_mem)
{
  int retval;
  CVodeMem cv_mem;
  CVLsMem cvls_mem;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Call user pset routine to update preconditioner and possibly
     reset jcur (pass !jbad as update suggestion) */
  retval = cvls_mem->pset(cv_mem->cv_tn, cvls_mem->ycur, cvls_mem->fcur,
                          !(cvls_mem->jbad), &cv_mem->cv_jcur, cv_mem->cv_gamma,
                          cvls_mem->P_data);
  return (retval);
}